

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

_glist * glist_addglist(_glist *g,t_symbol *sym,t_float x1,t_float y1,t_float x2,t_float y2,
                       t_float px1,t_float py1,t_float px2,t_float py2)

{
  char cVar1;
  char *__s1;
  int iVar2;
  _glist *x;
  t_pd *pp_Var3;
  int *piVar4;
  _binbuf *p_Var5;
  t_symbol *ptVar6;
  t_float tVar7;
  t_float tVar8;
  t_float tVar9;
  char buf [40];
  char local_58 [40];
  
  x = (_glist *)pd_new(canvas_class);
  glist_init(x);
  (x->gl_obj).field_0x2e = ((x->gl_obj).field_0x2e & 0xfc) + 1;
  __s1 = sym->s_name;
  cVar1 = *__s1;
  if (cVar1 == '\0') {
    glist_addglist::gcount = glist_addglist::gcount + 1;
    sprintf(local_58,"graph%d");
    sym = gensym(local_58);
  }
  else {
    iVar2 = strncmp(__s1,"graph",5);
    if ((iVar2 == 0) && (iVar2 = atoi(__s1 + 5), glist_addglist::gcount < iVar2)) {
      glist_addglist::gcount = iVar2;
    }
  }
  tVar7 = py1;
  tVar8 = y2;
  tVar9 = y1;
  if (py2 < py1) {
    tVar7 = py2;
    tVar8 = y1;
    tVar9 = y2;
    py2 = py1;
  }
  if ((x1 != x2) || (NAN(x1) || NAN(x2))) {
    if ((y2 != y1) || (NAN(y2) || NAN(y1))) goto LAB_00138271;
  }
  x1 = 0.0;
  tVar9 = 1.0;
  x2 = 100.0;
  tVar8 = -1.0;
LAB_00138271:
  if ((px2 <= px1) || (py2 <= tVar7)) {
    py2 = 160.0;
    px2 = 300.0;
    tVar7 = 20.0;
    px1 = 100.0;
  }
  x->gl_name = sym;
  x->gl_x1 = x1;
  x->gl_x2 = x2;
  x->gl_y1 = tVar9;
  x->gl_y2 = tVar8;
  (x->gl_obj).te_xpix = (short)(int)px1;
  (x->gl_obj).te_ypix = (short)(int)tVar7;
  x->gl_pixwidth = (int)(px2 - px1);
  x->gl_pixheight = (int)(py2 - tVar7);
  pp_Var3 = pd_findbyclass(&s__X,canvas_class);
  if (pp_Var3 == (t_pd *)0x0) {
    piVar4 = &sys_defaultfont;
  }
  else {
    pp_Var3 = pd_findbyclass(&s__X,canvas_class);
    piVar4 = (int *)(pp_Var3 + 0x1a);
  }
  x->gl_font = *piVar4;
  x->gl_zoom = g->gl_zoom;
  x->gl_screenx1 = 0;
  x->gl_screeny1 = 0x32;
  x->gl_screenx2 = 0x1c2;
  x->gl_screeny2 = 300;
  x->gl_owner = g;
  canvas_bind(x);
  *(ushort *)&x->field_0xe8 = (ushort)*(undefined4 *)&x->field_0xe8 & 0xfe7f | 0x100;
  p_Var5 = binbuf_new();
  (x->gl_obj).te_binbuf = p_Var5;
  canvas_undo_init(x);
  p_Var5 = (x->gl_obj).te_binbuf;
  ptVar6 = gensym("graph");
  binbuf_addv(p_Var5,"s",ptVar6);
  if (cVar1 != '\0') {
    pd_pushsym((t_pd *)x);
  }
  glist_add(g,(t_gobj *)x);
  return x;
}

Assistant:

t_glist *glist_addglist(t_glist *g, t_symbol *sym,
    t_float x1, t_float y1, t_float x2, t_float y2,
    t_float px1, t_float py1, t_float px2, t_float py2)
{
    static int gcount = 0;  /* it's OK if two threads get the same value */
    int zz;
    int menu = 0;
    const char *str;
    t_glist *x = (t_glist *)pd_new(canvas_class);
    glist_init(x);
    x->gl_obj.te_type = T_OBJECT;
    if (!*sym->s_name)
    {
        char buf[40];
        sprintf(buf, "graph%d", ++gcount);
        sym = gensym(buf);
        menu = 1;
    }
    else if (!strncmp((str = sym->s_name), "graph", 5)
        && (zz = atoi(str + 5)) > gcount)
            gcount = zz;
        /* in 0.34 and earlier, the pixel rectangle and the y bounds were
        reversed; this would behave the same, except that the dialog window
        would be confusing.  The "correct" way is to have "py1" be the value
        that is higher on the screen. */
    if (py2 < py1)
    {
        t_float zz;
        zz = y2;
        y2 = y1;
        y1 = zz;
        zz = py2;
        py2 = py1;
        py1 = zz;
    }
    if (x1 == x2 || y1 == y2)
        x1 = 0, x2 = 100, y1 = 1, y2 = -1;
    if (px1 >= px2 || py1 >= py2)
        px1 = 100, py1 = 20, px2 = 100 + GLIST_DEFGRAPHWIDTH,
            py2 = 20 + GLIST_DEFGRAPHHEIGHT;
    x->gl_name = sym;
    x->gl_x1 = x1;
    x->gl_x2 = x2;
    x->gl_y1 = y1;
    x->gl_y2 = y2;
    x->gl_obj.te_xpix = px1;
    x->gl_obj.te_ypix = py1;
    x->gl_pixwidth = px2 - px1;
    x->gl_pixheight = py2 - py1;
    x->gl_font =  (canvas_getcurrent() ?
        canvas_getcurrent()->gl_font : sys_defaultfont);
    x->gl_zoom = g->gl_zoom;
    x->gl_screenx1 = GLIST_DEFCANVASXLOC;
    x->gl_screeny1 = GLIST_DEFCANVASYLOC;
    x->gl_screenx2 = GLIST_DEFCANVASWIDTH;
    x->gl_screeny2 = GLIST_DEFCANVASHEIGHT;
    x->gl_owner = g;
    canvas_bind(x);
    x->gl_isgraph = 1;
    x->gl_goprect = 0;
    x->gl_obj.te_binbuf = binbuf_new();
        /* initialize private data, like the undo-queue */
    canvas_undo_init(x);

    binbuf_addv(x->gl_obj.te_binbuf, "s", gensym("graph"));
    if (!menu)
        pd_pushsym(&x->gl_pd);
    glist_add(g, &x->gl_gobj);
    return (x);
}